

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O0

bool __thiscall
BamTools::Internal::BamReaderPrivate::GetNextAlignmentCore
          (BamReaderPrivate *this,BamAlignment *alignment)

{
  bool bVar1;
  RegionState RVar2;
  long in_RSI;
  long in_RDI;
  string message;
  string streamError;
  BamException *e;
  RegionState state;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  RegionState RVar3;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 uVar4;
  BamRandomAccessController *in_stack_ffffffffffffff08;
  BamAlignment *in_stack_ffffffffffffff90;
  BamReaderPrivate *in_stack_ffffffffffffff98;
  
  bVar1 = BgzfStream::IsOpen((BgzfStream *)
                             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  if ((bVar1) &&
     ((bVar1 = BamRandomAccessController::HasRegion((BamRandomAccessController *)0x1c1972), !bVar1
      || (bVar1 = BamRandomAccessController::RegionHasAlignments
                            ((BamRandomAccessController *)(in_RDI + 0x1a8)), bVar1)))) {
    bVar1 = LoadNextAlignment(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    uVar4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff04);
    if (bVar1) {
      RVar2 = BamRandomAccessController::AlignmentState
                        (in_stack_ffffffffffffff08,
                         (BamAlignment *)CONCAT44(uVar4,in_stack_ffffffffffffff00));
      RVar3 = RVar2;
      while (RVar2 != AfterRegion) {
        if (RVar2 == OverlapsRegion) {
          *(undefined1 *)(in_RSI + 0x130) = 1;
          return true;
        }
        bVar1 = LoadNextAlignment(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        if (!bVar1) {
          return false;
        }
        RVar2 = BamRandomAccessController::AlignmentState
                          (in_stack_ffffffffffffff08,(BamAlignment *)CONCAT44(uVar4,RVar3));
      }
    }
  }
  return false;
}

Assistant:

bool BamReaderPrivate::GetNextAlignmentCore(BamAlignment& alignment)
{

    // skip if stream not opened
    if (!m_stream.IsOpen()) return false;

    try {

        // skip if region is set but has no alignments
        if (m_randomAccessController.HasRegion() &&
            !m_randomAccessController.RegionHasAlignments()) {
            return false;
        }

        // if can't read next alignment
        if (!LoadNextAlignment(alignment)) return false;

        // check alignment's region-overlap state
        BamRandomAccessController::RegionState state =
            m_randomAccessController.AlignmentState(alignment);

        // if alignment starts after region, no need to keep reading
        if (state == BamRandomAccessController::AfterRegion) return false;

        // read until overlap is found
        while (state != BamRandomAccessController::OverlapsRegion) {

            // if can't read next alignment
            if (!LoadNextAlignment(alignment)) return false;

            // check alignment's region-overlap state
            state = m_randomAccessController.AlignmentState(alignment);

            // if alignment starts after region, no need to keep reading
            if (state == BamRandomAccessController::AfterRegion) return false;
        }

        // if we get here, we found the next 'valid' alignment
        // (e.g. overlaps current region if one was set, simply the next alignment if not)
        alignment.SupportData.HasCoreOnly = true;
        return true;

    } catch (BamException& e) {
        const std::string streamError = e.what();
        const std::string message =
            std::string("encountered error reading BAM alignment: \n\t") + streamError;
        SetErrorString("BamReader::GetNextAlignmentCore", message);
        return false;
    }
}